

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O0

vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *
dgrminer::find_backward_edge_candidates
          (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
           *__return_storage_ptr__,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *adj_list,
          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
          *adj_more_info,int src,int dst,vector<int,_std::allocator<int>_> *real_ids_src,
          vector<int,_std::allocator<int>_> *real_ids_dst,
          vector<int,_std::allocator<int>_> *real_ids_dst_ind)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  size_type sVar8;
  reference adjacencyinfo;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar9;
  array<int,_8UL> local_e0;
  ulong local_c0;
  size_t i_2;
  bool can_be_used;
  ulong uStack_b0;
  int v;
  size_t i_1;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
  occupied_edges_from_other_direction;
  ulong local_70;
  size_t i;
  set<int,_std::less<int>,_std::allocator<int>_> occupied_from_the_same_direction;
  vector<int,_std::allocator<int>_> *real_ids_src_local;
  int dst_local;
  int src_local;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  *adj_more_info_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *adj_list_local;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *edge_candidates;
  
  occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (__return_storage_ptr__);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&i);
  for (local_70 = 0; sVar3 = std::vector<int,_std::allocator<int>_>::size(real_ids_src),
      local_70 < sVar3; local_70 = local_70 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](real_ids_src,local_70);
    if ((*pvVar4 == src) &&
       (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](real_ids_dst,local_70),
       *pvVar4 == dst)) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](real_ids_dst_ind,local_70);
      pVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&i,pvVar4);
      occupied_edges_from_other_direction.
      super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pVar9.first._M_node;
    }
  }
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&i_1);
  for (uStack_b0 = 0; uVar1 = uStack_b0,
      sVar3 = std::vector<int,_std::allocator<int>_>::size(real_ids_src), uVar1 < sVar3;
      uStack_b0 = uStack_b0 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](real_ids_src,uStack_b0);
    if ((*pvVar4 == dst) &&
       (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](real_ids_dst,uStack_b0),
       *pvVar4 == src)) {
      pvVar5 = std::
               vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               ::operator[](adj_more_info,(long)dst);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](real_ids_dst_ind,uStack_b0);
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (pvVar5,(long)*pvVar4);
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&i_1,pvVar6
                );
    }
  }
  pvVar7 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](adj_list,(long)src);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
  i_2._4_4_ = (int)sVar3;
  do {
    do {
      i_2._4_4_ = i_2._4_4_ + -1;
      if (i_2._4_4_ < 0) {
        occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
                  ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&i_1);
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)&i);
        if ((occupied_from_the_same_direction._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_
            & 1) == 0) {
          std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
                    (__return_storage_ptr__);
        }
        return __return_storage_ptr__;
      }
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](adj_list,(long)src);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)i_2._4_4_);
    } while ((*pvVar4 != dst) ||
            (sVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)&i,
                                (key_type *)((long)&i_2 + 4)), sVar8 != 0));
    i_2._3_1_ = 1;
    for (local_c0 = 0; uVar1 = local_c0,
        sVar3 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::size
                          ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                           &i_1), uVar1 < sVar3; local_c0 = local_c0 + 1) {
      pvVar5 = std::
               vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               ::operator[](adj_more_info,(long)src);
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (pvVar5,(long)i_2._4_4_);
      adjacencyinfo =
           std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                     ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)&i_1,
                      local_c0);
      flipAdjacencyInfo(&local_e0,adjacencyinfo);
      bVar2 = is_adj_info_equal_to(pvVar6,&local_e0,false);
      if (bVar2) {
        i_2._3_1_ = 0;
        break;
      }
    }
    if ((i_2._3_1_ & 1) != 0) {
      pvVar5 = std::
               vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               ::operator[](adj_more_info,(long)src);
      pvVar6 = std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::operator[]
                         (pvVar5,(long)i_2._4_4_);
      std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                (__return_storage_ptr__,pvVar6);
    }
  } while( true );
}

Assistant:

std::vector<std::array<int, 8>> find_backward_edge_candidates(std::vector<std::vector<int>> &adj_list,
		std::vector<std::vector<std::array<int, 8>>> &adj_more_info, int src, int dst,
		std::vector<int> &real_ids_src, std::vector<int> &real_ids_dst, std::vector<int> &real_ids_dst_ind)
	{
		std::vector<std::array<int, 8>> edge_candidates;

		std::set<int> occupied_from_the_same_direction;
		for (size_t i = 0; i < real_ids_src.size(); i++)
		{
			if (real_ids_src[i] == src && real_ids_dst[i] == dst) {
				occupied_from_the_same_direction.insert(real_ids_dst_ind[i]);
			}
		}
		std::vector<std::array<int, 8>> occupied_edges_from_other_direction;
		for (size_t i = 0; i < real_ids_src.size(); i++)
		{
			if (real_ids_src[i] == dst && real_ids_dst[i] == src) {
				occupied_edges_from_other_direction.push_back(adj_more_info[dst][real_ids_dst_ind[i]]);
			}
		}

		// do it in a reversed order, so we can find dummy first - this property is used in the .enumerate function
		for (int v = adj_list[src].size() - 1; v >= 0; v--)
		{
			//if it is the appropriate edge and it can be taken (if it is not occupied from the same direction):
			if (adj_list[src][v] == dst && occupied_from_the_same_direction.count(v) == 0)
			{
				bool can_be_used = true;
				for (size_t i = 0; i < occupied_edges_from_other_direction.size(); i++)
				{
					if (is_adj_info_equal_to(adj_more_info[src][v], flipAdjacencyInfo(occupied_edges_from_other_direction[i]), false))
					{
						can_be_used = false;
						break;
					}
				}
				if (can_be_used)
				{
					edge_candidates.push_back(adj_more_info[src][v]);
				}
			}
		}
		return edge_candidates;
	}